

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_227ed00::PeerManagerImpl::InitializeNode
          (PeerManagerImpl *this,CNode *node,ServiceFlags our_services)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  ConnectionType CVar3;
  long lVar4;
  _func_int **peer_00;
  long lVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  size_t sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar11;
  _Base_ptr *pp_Var12;
  _Base_ptr p_Var13;
  RecursiveMutex *__p;
  _Link_type __p_00;
  iterator __pos_1;
  ServiceFlags SVar14;
  iterator __pos;
  long in_FS_OFFSET;
  PeerRef peer;
  __allocator_type __a2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  peer_00 = (_func_int **)node->id;
  __p = &cs_main;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock24,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x6ba,false);
  CVar3 = node->m_conn_type;
  p_Var7 = (_Rb_tree_node_base *)operator_new(0xc0);
  p_Var7[3]._M_parent = (_Base_ptr)0x0;
  *(undefined2 *)&p_Var7[5]._M_parent = 0;
  p_Var7[5]._M_left = (_Base_ptr)0x0;
  *(undefined4 *)((long)&p_Var7[4]._M_parent + 7) = 0;
  *(_func_int ***)(p_Var7 + 1) = peer_00;
  p_Var7[1]._M_parent = (_Base_ptr)0x0;
  p_Var7[1]._M_left = (_Base_ptr)0x0;
  p_Var7[1]._M_right = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var7 + 2) = 0;
  p_Var7[2]._M_parent = (_Base_ptr)0x0;
  p_Var7[2]._M_left = (_Base_ptr)0x0;
  *(undefined8 *)((long)&p_Var7[2]._M_left + 1) = 0;
  *(undefined8 *)((long)&p_Var7[2]._M_right + 1) = 0;
  p_Var7[3]._M_right = (_Base_ptr)&p_Var7[3]._M_left;
  p_Var7[3]._M_left = (_Base_ptr)&p_Var7[3]._M_left;
  p_Var7[4]._M_right = (_Base_ptr)0x0;
  *(undefined8 *)(p_Var7 + 5) = 0;
  *(undefined8 *)(p_Var7 + 4) = 0;
  p_Var7[4]._M_parent = (_Base_ptr)0x0;
  *(bool *)&p_Var7[5]._M_right = CVar3 == INBOUND;
  p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  if (((this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (p_Var13 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
     (long)peer_00 <= *(long *)(p_Var13 + 1))) {
    bVar6 = true;
    pp_Var12 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    while (p_Var8 = *pp_Var12, p_Var8 != (_Base_ptr)0x0) {
      bVar6 = (long)peer_00 < *(long *)(p_Var8 + 1);
      p_Var13 = p_Var8;
      pp_Var12 = &p_Var8->_M_left + (*(long *)(p_Var8 + 1) <= (long)peer_00);
    }
    p_Var8 = p_Var13;
    if (bVar6) {
      if (p_Var13 == (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      goto LAB_007370b0;
      p_Var8 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var13);
    }
    if (*(long *)(p_Var8 + 1) < (long)peer_00) goto LAB_007370b0;
    std::
    _Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
    ::_M_drop_node((_Rb_tree<long,_std::pair<const_long,_(anonymous_namespace)::CNodeState>,_std::_Select1st<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
                    *)p_Var7,(_Link_type)__p);
  }
  else {
LAB_007370b0:
    if (p_Var1 == (_Rb_tree_header *)p_Var13) {
      bVar6 = true;
    }
    else {
      bVar6 = (long)peer_00 < *(long *)(p_Var13 + 1);
    }
    std::_Rb_tree_insert_and_rebalance
              (bVar6,p_Var7,(_Rb_tree_node_base *)p_Var13,(_Rb_tree_node_base *)p_Var1);
    psVar2 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    *psVar2 = *psVar2 + 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock24.super_unique_lock);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&criticalblock24,&this->m_tx_download_mutex,
             "m_tx_download_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x6be,false);
  sVar9 = TxRequestTracker::Count(&this->m_txrequest,(NodeId)peer_00);
  if (sVar9 != 0) {
    __assert_fail("m_txrequest.Count(nodeid) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
                  ,0x6bf,
                  "virtual void (anonymous namespace)::PeerManagerImpl::InitializeNode(const CNode &, ServiceFlags)"
                 );
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock24);
  SVar14 = node->m_permission_flags * 2 & 4 | our_services;
  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x290);
  criticalblock24.super_unique_lock._M_device = (mutex_type *)&__a2;
  p_Var10->_M_use_count = 1;
  p_Var10->_M_weak_count = 1;
  p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01150698;
  p_Var10[1]._vptr__Sp_counted_base = peer_00;
  p_Var10[1]._M_use_count = (int)SVar14;
  p_Var10[1]._M_weak_count = (int)(SVar14 >> 0x20);
  p_Var10[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[4]._M_use_count = 0;
  p_Var10[4]._M_weak_count = 0;
  p_Var10[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[3]._M_use_count = 0;
  p_Var10[3]._M_weak_count = 0;
  p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[2]._M_use_count = 0;
  p_Var10[2]._M_weak_count = 0;
  *(undefined1 *)&p_Var10[5]._vptr__Sp_counted_base = 0;
  *(undefined8 *)((long)&p_Var10[0xc]._vptr__Sp_counted_base + 1) = 0;
  *(undefined8 *)((long)&p_Var10[0xc]._M_use_count + 1) = 0;
  p_Var10[0xb]._M_use_count = 0;
  p_Var10[0xb]._M_weak_count = 0;
  p_Var10[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[10]._M_use_count = 0;
  p_Var10[10]._M_weak_count = 0;
  p_Var10[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[9]._M_use_count = 0;
  p_Var10[9]._M_weak_count = 0;
  p_Var10[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[8]._M_use_count = 0;
  p_Var10[8]._M_weak_count = 0;
  p_Var10[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[7]._M_use_count = 0;
  p_Var10[7]._M_weak_count = 0;
  p_Var10[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[6]._M_use_count = 0;
  p_Var10[6]._M_weak_count = 0;
  p_Var10[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[5]._M_use_count = 0;
  p_Var10[5]._M_weak_count = 0;
  p_Var10[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined4 *)((long)&p_Var10[0xd]._vptr__Sp_counted_base + 4) = 0xffffffff;
  p_Var10[0xd]._M_use_count = 0;
  p_Var10[0xd]._M_weak_count = 0;
  p_Var10[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined2 *)&p_Var10[0xe]._M_use_count = 0;
  p_Var10[0x11]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x11]._M_use_count = 0;
  p_Var10[0x11]._M_weak_count = 0;
  *(undefined2 *)&p_Var10[0x12]._vptr__Sp_counted_base = 0;
  p_Var10[0x10]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x10]._M_use_count = 0;
  p_Var10[0x10]._M_weak_count = 0;
  p_Var10[0xf]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0xf]._M_use_count = 0;
  p_Var10[0xf]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var10[0x15]._vptr__Sp_counted_base + 2) = 0;
  *(undefined8 *)((long)&p_Var10[0x15]._M_use_count + 2) = 0;
  p_Var10[0x14]._M_use_count = 0;
  p_Var10[0x14]._M_weak_count = 0;
  p_Var10[0x15]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x13]._M_use_count = 0;
  p_Var10[0x13]._M_weak_count = 0;
  p_Var10[0x14]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x12]._M_use_count = 0;
  p_Var10[0x12]._M_weak_count = 0;
  p_Var10[0x13]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x16]._M_use_count = 0;
  p_Var10[0x16]._M_weak_count = 0x3ff00000;
  criticalblock24.super_unique_lock._8_8_ = p_Var10;
  tVar11 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                     ();
  p_Var10[0x17]._vptr__Sp_counted_base = (_func_int **)tVar11.__d.__r;
  p_Var10[0x19]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x19]._M_use_count = 0;
  p_Var10[0x19]._M_weak_count = 0;
  p_Var10[0x1b]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x1a]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x1a]._M_use_count = 0;
  p_Var10[0x1a]._M_weak_count = 0;
  p_Var10[0x17]._M_use_count = 0;
  p_Var10[0x17]._M_weak_count = 0;
  p_Var10[0x18]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var10[0x18]._M_use_count = 0;
  std::_Deque_base<CInv,_std::allocator<CInv>_>::_Deque_base
            ((_Deque_base<CInv,_std::allocator<CInv>_> *)&p_Var10[0x1b]._M_use_count);
  p_Var10[0x24]._M_use_count = 0;
  p_Var10[0x24]._M_weak_count = 0;
  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var10 + 1);
  *(undefined1 *)&p_Var10[0x25]._vptr__Sp_counted_base = 0;
  p_Var10[0x20]._M_use_count = 0;
  p_Var10[0x20]._M_weak_count = 0;
  p_Var10[0x21]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x21]._M_use_count = 0;
  p_Var10[0x21]._M_weak_count = 0;
  p_Var10[0x22]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x22]._M_use_count = 0;
  p_Var10[0x22]._M_weak_count = 0;
  p_Var10[0x23]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined8 *)((long)&p_Var10[0x23]._vptr__Sp_counted_base + 1) = 0;
  *(undefined8 *)((long)&p_Var10[0x23]._M_use_count + 1) = 0;
  p_Var10[0x25]._M_use_count = 0;
  p_Var10[0x25]._M_weak_count = 0;
  p_Var10[0x26]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x28]._M_use_count = 0;
  p_Var10[0x28]._M_weak_count = 0;
  criticalblock24.super_unique_lock._M_owns = false;
  criticalblock24.super_unique_lock._9_7_ = 0;
  p_Var10[0x26]._M_use_count = 0;
  p_Var10[0x26]._M_weak_count = 0;
  p_Var10[0x27]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var10[0x27]._M_use_count = 0;
  p_Var10[0x27]._M_weak_count = 0;
  p_Var10[0x28]._vptr__Sp_counted_base = (_func_int **)0x0;
  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var10;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::Peer,_std::allocator<(anonymous_namespace)::Peer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::Peer,_std::allocator<(anonymous_namespace)::Peer>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&criticalblock24);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&criticalblock24,&this->m_peer_mutex,
             "m_peer_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
             ,0x6c8,false);
  p_Var7 = (_Rb_tree_node_base *)operator_new(0x38);
  p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
  *(_func_int ***)(p_Var7 + 1) = peer_00;
  __p_00 = (_Link_type)&peer;
  std::shared_ptr<(anonymous_namespace)::Peer>::shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)&p_Var7[1]._M_parent,
             (shared_ptr<(anonymous_namespace)::Peer> *)__p_00);
  lVar5 = *(long *)(p_Var7 + 1);
  if (((this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (p_Var13 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
     lVar5 <= *(long *)(p_Var13 + 1))) {
    bVar6 = true;
    pp_Var12 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = &p_Var1->_M_header;
    while (p_Var8 = *pp_Var12, p_Var8 != (_Base_ptr)0x0) {
      bVar6 = lVar5 < *(long *)(p_Var8 + 1);
      p_Var13 = p_Var8;
      pp_Var12 = &p_Var8->_M_left + (*(long *)(p_Var8 + 1) <= lVar5);
    }
    p_Var8 = p_Var13;
    if (bVar6) {
      if (p_Var13 == (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
      goto LAB_007373dd;
      p_Var8 = (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var13);
    }
    if (lVar5 <= *(long *)(p_Var8 + 1)) {
      std::
      _Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
      ::_M_drop_node((_Rb_tree<long,_std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>,_std::_Select1st<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
                      *)p_Var7,__p_00);
      goto LAB_0073740f;
    }
  }
LAB_007373dd:
  if (p_Var1 == (_Rb_tree_header *)p_Var13) {
    bVar6 = true;
  }
  else {
    bVar6 = lVar5 < *(long *)(p_Var13 + 1);
  }
  std::_Rb_tree_insert_and_rebalance
            (bVar6,p_Var7,(_Rb_tree_node_base *)p_Var13,(_Rb_tree_node_base *)p_Var1);
  psVar2 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar2 = *psVar2 + 1;
LAB_0073740f:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock24);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::InitializeNode(const CNode& node, ServiceFlags our_services)
{
    NodeId nodeid = node.GetId();
    {
        LOCK(cs_main); // For m_node_states
        m_node_states.emplace_hint(m_node_states.end(), std::piecewise_construct, std::forward_as_tuple(nodeid), std::forward_as_tuple(node.IsInboundConn()));
    }
    {
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Count(nodeid) == 0);
    }

    if (NetPermissions::HasFlag(node.m_permission_flags, NetPermissionFlags::BloomFilter)) {
        our_services = static_cast<ServiceFlags>(our_services | NODE_BLOOM);
    }

    PeerRef peer = std::make_shared<Peer>(nodeid, our_services);
    {
        LOCK(m_peer_mutex);
        m_peer_map.emplace_hint(m_peer_map.end(), nodeid, peer);
    }
}